

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::moveRowsTreeSameBranch(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  QChar local_1ea;
  value_type args;
  QModelIndex local_1c8;
  QPersistentModelIndex oneIndex;
  QModelIndex parIndex;
  GenericModel testModel;
  QChar local_172;
  QPersistentModelIndex twoIndex;
  QSignalSpy *spyArr [2];
  anon_class_16_2_c8a22591 resetData;
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy rowsMovedSpy;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  ModelTest::ModelTest(&probe,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x2);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x3);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::index((int)&parIndex,(int)&testModel,(QModelIndex *)0x1);
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeMovedSpy,(QObject *)&testModel,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsAboutToBeMovedSpy.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x67c);
  if (cVar2 == '\0') goto LAB_0011fd78;
  QSignalSpy::QSignalSpy
            (&rowsMovedSpy,(QObject *)&testModel,
             "2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsMovedSpy.sig.d.size != 0,"rowsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x67e);
  if (cVar2 != '\0') {
    spyArr[0] = &rowsAboutToBeMovedSpy;
    spyArr[1] = &rowsMovedSpy;
    resetData.testModel = &testModel;
    resetData.parIndex = &parIndex;
    moveRowsTreeSameBranch::anon_class_16_2_c8a22591::operator()(&resetData);
    bVar3 = GenericModel::moveRows
                      ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,(int)&parIndex)
    ;
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 2, 1, parIndex, -1)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x688);
    if (cVar2 != '\0') {
      lVar6 = 0;
      do {
        if (lVar6 == 0x10) {
          bVar3 = GenericModel::moveRows
                            ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                             (int)&parIndex);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveRows(parIndex, 2, 1, parIndex, 7)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x68b);
          if (cVar2 != '\0') {
            lVar6 = 0;
            goto LAB_0011e259;
          }
          break;
        }
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar6) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x68a);
        lVar6 = lVar6 + 8;
      } while (cVar2 != '\0');
    }
  }
  goto LAB_0011fd6b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar6) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x68d);
    lVar6 = lVar6 + 8;
    if (cVar2 == '\0') break;
LAB_0011e259:
    if (lVar6 == 0x10) {
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&parIndex,-1,(QModelIndex *)0x1,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, -1, 1, parIndex, 3)",
                             "",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x68e);
      if (cVar2 != '\0') {
        lVar6 = 0;
        goto LAB_0011e2ef;
      }
      break;
    }
  }
  goto LAB_0011fd6b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar6) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x690);
    lVar6 = lVar6 + 8;
    if (cVar2 == '\0') break;
LAB_0011e2ef:
    if (lVar6 == 0x10) {
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&parIndex,6,(QModelIndex *)0x1,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 6, 1, parIndex, 3)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x691);
      if (cVar2 != '\0') {
        lVar6 = 0;
        goto LAB_0011e385;
      }
      break;
    }
  }
  goto LAB_0011fd6b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar6) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x693);
    lVar6 = lVar6 + 8;
    if (cVar2 == '\0') break;
LAB_0011e385:
    if (lVar6 == 0x10) {
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&parIndex,1,(QModelIndex *)0x2,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 1, 2, parIndex, 2)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x694);
      if (cVar2 != '\0') {
        lVar6 = 0;
        goto LAB_0011e41a;
      }
      break;
    }
  }
  goto LAB_0011fd6b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar6) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x696);
    lVar6 = lVar6 + 8;
    if (cVar2 == '\0') break;
LAB_0011e41a:
    if (lVar6 == 0x10) {
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&parIndex,1,(QModelIndex *)0x2,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 1, 2, parIndex, 3)",""
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x697);
      if (cVar2 != '\0') {
        lVar6 = 0;
        goto LAB_0011e4b0;
      }
      break;
    }
  }
  goto LAB_0011fd6b;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar6) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x699);
    lVar6 = lVar6 + 8;
    if (cVar2 == '\0') break;
LAB_0011e4b0:
    if (lVar6 == 0x10) {
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x2);
      QPersistentModelIndex::QPersistentModelIndex(&twoIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                               (int)&parIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(parIndex, 2, 1, parIndex, 4)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x69c);
      if (cVar2 == '\0') goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,0,"testModel.index(0, 0, parIndex).data().toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x69d);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,1,"testModel.index(1, 0, parIndex).data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x69e);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,3,"testModel.index(2, 0, parIndex).data().toInt()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x69f);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,2,"testModel.index(3, 0, parIndex).data().toInt()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6a0);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,4,"testModel.index(4, 0, parIndex).data().toInt()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6a1);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,5,"testModel.index(5, 0, parIndex).data().toInt()","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6a2);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1ea.ucs = L'a';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1ea,
                         "testModel.index(0, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'a\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6a3);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1ea.ucs = L'b';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1ea,
                         "testModel.index(1, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'b\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6a4);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1ea.ucs = L'd';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1ea,
                         "testModel.index(2, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'d\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6a5);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1ea.ucs = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1ea,
                         "testModel.index(3, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6a6);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1ea.ucs = L'e';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1ea,
                         "testModel.index(4, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'e\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6a7);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011fd5e;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
      local_1ea.ucs = L'f';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&oneIndex,&local_1ea,
                         "testModel.index(5, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'f\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6a8);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011fd5e;
      QPersistentModelIndex::data((int)&args);
      local_1c8.r._0_2_ = qvariant_cast<QChar>((QVariant *)&args);
      _oneIndex = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&local_1c8,(QChar *)&oneIndex,"twoIndex.data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6a9);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_0011fd5e;
      iVar5 = QPersistentModelIndex::row();
      cVar2 = QTest::qCompare(iVar5,3,"twoIndex.row()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6aa);
      if (cVar2 == '\0') goto LAB_0011fd5e;
      lVar6 = 0;
      goto LAB_0011eb88;
    }
  }
  goto LAB_0011fd6b;
  while( true ) {
    lVar1 = *(long *)((long)spyArr + lVar6);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6ac);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_1c8,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_1c8,&parIndex,"args.at(0).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x6ae);
    if (!bVar4) goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6af);
    if (cVar2 == '\0') goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6b0);
    if (cVar2 == '\0') goto LAB_0011fd54;
    qvariant_cast<QModelIndex>(&local_1c8,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_1c8,&parIndex,"args.at(3).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x6b1);
    if (!bVar4) goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,4,"args.at(4).toInt()","4",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6b2);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar6 = lVar6 + 8;
    if (cVar2 == '\0') break;
LAB_0011eb88:
    if (lVar6 == 0x10) {
      moveRowsTreeSameBranch::anon_class_16_2_c8a22591::operator()(&resetData);
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x2);
      QPersistentModelIndex::operator=(&twoIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                               (int)&parIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(parIndex, 2, 1, parIndex, 0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x6b7);
      if (cVar2 != '\0') {
        GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&args,&local_1c8,0);
        iVar5 = QVariant::toInt((bool *)&args);
        cVar2 = QTest::qCompare(iVar5,2,"testModel.index(0, 0, parIndex).data().toInt()","2",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x6b8);
        QVariant::~QVariant((QVariant *)&args);
        if (cVar2 != '\0') {
          GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x1);
          QModelIndex::data((QVariant *)&args,&local_1c8,0);
          iVar5 = QVariant::toInt((bool *)&args);
          cVar2 = QTest::qCompare(iVar5,0,"testModel.index(1, 0, parIndex).data().toInt()","0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x6b9);
          QVariant::~QVariant((QVariant *)&args);
          if (cVar2 != '\0') {
            GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x2);
            QModelIndex::data((QVariant *)&args,&local_1c8,0);
            iVar5 = QVariant::toInt((bool *)&args);
            cVar2 = QTest::qCompare(iVar5,1,"testModel.index(2, 0, parIndex).data().toInt()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x6ba);
            QVariant::~QVariant((QVariant *)&args);
            if (cVar2 != '\0') {
              GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x3);
              QModelIndex::data((QVariant *)&args,&local_1c8,0);
              iVar5 = QVariant::toInt((bool *)&args);
              cVar2 = QTest::qCompare(iVar5,3,"testModel.index(3, 0, parIndex).data().toInt()","3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x6bb);
              QVariant::~QVariant((QVariant *)&args);
              if (cVar2 != '\0') {
                GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x4);
                QModelIndex::data((QVariant *)&args,&local_1c8,0);
                iVar5 = QVariant::toInt((bool *)&args);
                cVar2 = QTest::qCompare(iVar5,4,"testModel.index(4, 0, parIndex).data().toInt()","4"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x6bc);
                QVariant::~QVariant((QVariant *)&args);
                if (cVar2 != '\0') {
                  GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x5);
                  QModelIndex::data((QVariant *)&args,&local_1c8,0);
                  iVar5 = QVariant::toInt((bool *)&args);
                  cVar2 = QTest::qCompare(iVar5,5,"testModel.index(5, 0, parIndex).data().toInt()",
                                          "5",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x6bd);
                  QVariant::~QVariant((QVariant *)&args);
                  if (cVar2 != '\0') {
                    GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x0);
                    QModelIndex::data((QVariant *)&args,&local_1c8,0);
                    _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                    local_1ea.ucs = L'c';
                    bVar4 = QTest::qCompare<QChar,QChar>
                                      ((QChar *)&oneIndex,&local_1ea,
                                       "testModel.index(0, 1, parIndex).data().value<QChar>()",
                                       "QChar(QLatin1Char(\'c\'))",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x6be);
                    QVariant::~QVariant((QVariant *)&args);
                    if (bVar4) {
                      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x1);
                      QModelIndex::data((QVariant *)&args,&local_1c8,0);
                      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                      local_1ea.ucs = L'a';
                      bVar4 = QTest::qCompare<QChar,QChar>
                                        ((QChar *)&oneIndex,&local_1ea,
                                         "testModel.index(1, 1, parIndex).data().value<QChar>()",
                                         "QChar(QLatin1Char(\'a\'))",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x6bf);
                      QVariant::~QVariant((QVariant *)&args);
                      if (bVar4) {
                        GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x2);
                        QModelIndex::data((QVariant *)&args,&local_1c8,0);
                        _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                        local_1ea.ucs = L'b';
                        bVar4 = QTest::qCompare<QChar,QChar>
                                          ((QChar *)&oneIndex,&local_1ea,
                                           "testModel.index(2, 1, parIndex).data().value<QChar>()",
                                           "QChar(QLatin1Char(\'b\'))",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x6c0);
                        QVariant::~QVariant((QVariant *)&args);
                        if (bVar4) {
                          GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x3);
                          QModelIndex::data((QVariant *)&args,&local_1c8,0);
                          _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                          local_1ea.ucs = L'd';
                          bVar4 = QTest::qCompare<QChar,QChar>
                                            ((QChar *)&oneIndex,&local_1ea,
                                             "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                             ,"QChar(QLatin1Char(\'d\'))",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x6c1);
                          QVariant::~QVariant((QVariant *)&args);
                          if (bVar4) {
                            GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x4);
                            QModelIndex::data((QVariant *)&args,&local_1c8,0);
                            _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                            local_1ea.ucs = L'e';
                            bVar4 = QTest::qCompare<QChar,QChar>
                                              ((QChar *)&oneIndex,&local_1ea,
                                               "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                               ,"QChar(QLatin1Char(\'e\'))",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x6c2);
                            QVariant::~QVariant((QVariant *)&args);
                            if (bVar4) {
                              GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x5
                                                 );
                              QModelIndex::data((QVariant *)&args,&local_1c8,0);
                              _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                              local_1ea.ucs = L'f';
                              bVar4 = QTest::qCompare<QChar,QChar>
                                                ((QChar *)&oneIndex,&local_1ea,
                                                 "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                 ,"QChar(QLatin1Char(\'f\'))",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x6c3);
                              QVariant::~QVariant((QVariant *)&args);
                              if (bVar4) {
                                QPersistentModelIndex::data((int)&args);
                                local_1c8.r._0_2_ = qvariant_cast<QChar>((QVariant *)&args);
                                _oneIndex = L'c';
                                bVar4 = QTest::qCompare<QChar,QChar>
                                                  ((QChar *)&local_1c8,(QChar *)&oneIndex,
                                                   "twoIndex.data().value<QChar>()",
                                                   "QChar(QLatin1Char(\'c\'))",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c4);
                                QVariant::~QVariant((QVariant *)&args);
                                if (bVar4) {
                                  iVar5 = QPersistentModelIndex::row();
                                  cVar2 = QTest::qCompare(iVar5,0,"twoIndex.row()","0",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6c5);
                                  if (cVar2 != '\0') {
                                    lVar6 = 0;
                                    goto LAB_0011f3b2;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0011fd5e;
  while( true ) {
    lVar1 = *(long *)((long)spyArr + lVar6);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6c7);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_1c8,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_1c8,&parIndex,"args.at(0).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x6c9);
    if (!bVar4) goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6ca);
    if (cVar2 == '\0') goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6cb);
    if (cVar2 == '\0') goto LAB_0011fd54;
    qvariant_cast<QModelIndex>(&local_1c8,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_1c8,&parIndex,"args.at(3).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x6cc);
    if (!bVar4) goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,0,"args.at(4).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6cd);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar6 = lVar6 + 8;
    if (cVar2 == '\0') break;
LAB_0011f3b2:
    if (lVar6 == 0x10) {
      moveRowsTreeSameBranch::anon_class_16_2_c8a22591::operator()(&resetData);
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x2);
      QPersistentModelIndex::operator=(&twoIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                               (int)&parIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(parIndex, 2, 1, parIndex, 6)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x6d2);
      if (cVar2 != '\0') {
        GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x0);
        QModelIndex::data((QVariant *)&args,&local_1c8,0);
        iVar5 = QVariant::toInt((bool *)&args);
        cVar2 = QTest::qCompare(iVar5,0,"testModel.index(0, 0, parIndex).data().toInt()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x6d3);
        QVariant::~QVariant((QVariant *)&args);
        if (cVar2 != '\0') {
          GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x1);
          QModelIndex::data((QVariant *)&args,&local_1c8,0);
          iVar5 = QVariant::toInt((bool *)&args);
          cVar2 = QTest::qCompare(iVar5,1,"testModel.index(1, 0, parIndex).data().toInt()","1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x6d4);
          QVariant::~QVariant((QVariant *)&args);
          if (cVar2 != '\0') {
            GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x2);
            QModelIndex::data((QVariant *)&args,&local_1c8,0);
            iVar5 = QVariant::toInt((bool *)&args);
            cVar2 = QTest::qCompare(iVar5,3,"testModel.index(2, 0, parIndex).data().toInt()","3",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x6d5);
            QVariant::~QVariant((QVariant *)&args);
            if (cVar2 != '\0') {
              GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x3);
              QModelIndex::data((QVariant *)&args,&local_1c8,0);
              iVar5 = QVariant::toInt((bool *)&args);
              cVar2 = QTest::qCompare(iVar5,4,"testModel.index(3, 0, parIndex).data().toInt()","4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x6d6);
              QVariant::~QVariant((QVariant *)&args);
              if (cVar2 != '\0') {
                GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x4);
                QModelIndex::data((QVariant *)&args,&local_1c8,0);
                iVar5 = QVariant::toInt((bool *)&args);
                cVar2 = QTest::qCompare(iVar5,5,"testModel.index(4, 0, parIndex).data().toInt()","5"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x6d7);
                QVariant::~QVariant((QVariant *)&args);
                if (cVar2 != '\0') {
                  GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x5);
                  QModelIndex::data((QVariant *)&args,&local_1c8,0);
                  iVar5 = QVariant::toInt((bool *)&args);
                  cVar2 = QTest::qCompare(iVar5,2,"testModel.index(5, 0, parIndex).data().toInt()",
                                          "2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x6d8);
                  QVariant::~QVariant((QVariant *)&args);
                  if (cVar2 != '\0') {
                    GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x0);
                    QModelIndex::data((QVariant *)&args,&local_1c8,0);
                    _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                    local_1ea.ucs = L'a';
                    bVar4 = QTest::qCompare<QChar,QChar>
                                      ((QChar *)&oneIndex,&local_1ea,
                                       "testModel.index(0, 1, parIndex).data().value<QChar>()",
                                       "QChar(QLatin1Char(\'a\'))",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x6d9);
                    QVariant::~QVariant((QVariant *)&args);
                    if (bVar4) {
                      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x1);
                      QModelIndex::data((QVariant *)&args,&local_1c8,0);
                      _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                      local_1ea.ucs = L'b';
                      bVar4 = QTest::qCompare<QChar,QChar>
                                        ((QChar *)&oneIndex,&local_1ea,
                                         "testModel.index(1, 1, parIndex).data().value<QChar>()",
                                         "QChar(QLatin1Char(\'b\'))",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                         ,0x6da);
                      QVariant::~QVariant((QVariant *)&args);
                      if (bVar4) {
                        GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x2);
                        QModelIndex::data((QVariant *)&args,&local_1c8,0);
                        _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                        local_1ea.ucs = L'd';
                        bVar4 = QTest::qCompare<QChar,QChar>
                                          ((QChar *)&oneIndex,&local_1ea,
                                           "testModel.index(2, 1, parIndex).data().value<QChar>()",
                                           "QChar(QLatin1Char(\'d\'))",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                           ,0x6db);
                        QVariant::~QVariant((QVariant *)&args);
                        if (bVar4) {
                          GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x3);
                          QModelIndex::data((QVariant *)&args,&local_1c8,0);
                          _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                          local_1ea.ucs = L'e';
                          bVar4 = QTest::qCompare<QChar,QChar>
                                            ((QChar *)&oneIndex,&local_1ea,
                                             "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                             ,"QChar(QLatin1Char(\'e\'))",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                             ,0x6dc);
                          QVariant::~QVariant((QVariant *)&args);
                          if (bVar4) {
                            GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x4);
                            QModelIndex::data((QVariant *)&args,&local_1c8,0);
                            _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                            local_1ea.ucs = L'f';
                            bVar4 = QTest::qCompare<QChar,QChar>
                                              ((QChar *)&oneIndex,&local_1ea,
                                               "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                               ,"QChar(QLatin1Char(\'f\'))",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                               ,0x6dd);
                            QVariant::~QVariant((QVariant *)&args);
                            if (bVar4) {
                              GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x5
                                                 );
                              QModelIndex::data((QVariant *)&args,&local_1c8,0);
                              _oneIndex = qvariant_cast<QChar>((QVariant *)&args);
                              local_1ea.ucs = L'c';
                              bVar4 = QTest::qCompare<QChar,QChar>
                                                ((QChar *)&oneIndex,&local_1ea,
                                                 "testModel.index(5, 1, parIndex).data().value<QChar>()"
                                                 ,"QChar(QLatin1Char(\'c\'))",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x6de);
                              QVariant::~QVariant((QVariant *)&args);
                              if (bVar4) {
                                QPersistentModelIndex::data((int)&args);
                                local_1c8.r._0_2_ = qvariant_cast<QChar>((QVariant *)&args);
                                _oneIndex = L'c';
                                bVar4 = QTest::qCompare<QChar,QChar>
                                                  ((QChar *)&local_1c8,(QChar *)&oneIndex,
                                                   "twoIndex.data().value<QChar>()",
                                                   "QChar(QLatin1Char(\'c\'))",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6df);
                                QVariant::~QVariant((QVariant *)&args);
                                if (bVar4) {
                                  iVar5 = QPersistentModelIndex::row();
                                  cVar2 = QTest::qCompare(iVar5,5,"twoIndex.row()","5",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x6e0);
                                  if (cVar2 != '\0') {
                                    lVar6 = 0;
                                    goto LAB_0011fbdd;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0011fd5e;
  while( true ) {
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_1c8,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_1c8,&parIndex,"args.at(0).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x6e4);
    if (!bVar4) goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6e5);
    if (cVar2 == '\0') goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6e6);
    if (cVar2 == '\0') goto LAB_0011fd54;
    qvariant_cast<QModelIndex>(&local_1c8,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_1c8,&parIndex,"args.at(3).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x6e7);
    if (!bVar4) goto LAB_0011fd54;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,6,"args.at(4).toInt()","6",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6e8);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar6 = lVar6 + 8;
    if (cVar2 == '\0') break;
LAB_0011fbdd:
    if (lVar6 == 0x10) {
      moveRowsTreeSameBranch::anon_class_16_2_c8a22591::operator()(&resetData);
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex(&oneIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&parIndex,0,(QModelIndex *)0x2,
                               (int)&parIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(parIndex, 0, 2, parIndex, 3)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x6ed);
      if (cVar2 == '\0') goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,2,"testModel.index(0, 0, parIndex).data().toInt()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6ee);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,0,"testModel.index(1, 0, parIndex).data().toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6ef);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,1,"testModel.index(2, 0, parIndex).data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6f0);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,3,"testModel.index(3, 0, parIndex).data().toInt()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6f1);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,4,"testModel.index(4, 0, parIndex).data().toInt()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6f2);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      iVar5 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar5,5,"testModel.index(5, 0, parIndex).data().toInt()","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6f3);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      local_1ea = qvariant_cast<QChar>((QVariant *)&args);
      local_172.ucs = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1ea,&local_172,
                         "testModel.index(0, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6f4);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      local_1ea = qvariant_cast<QChar>((QVariant *)&args);
      local_172.ucs = L'a';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1ea,&local_172,
                         "testModel.index(1, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'a\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6f5);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      local_1ea = qvariant_cast<QChar>((QVariant *)&args);
      local_172.ucs = L'b';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1ea,&local_172,
                         "testModel.index(2, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'b\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6f6);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      local_1ea = qvariant_cast<QChar>((QVariant *)&args);
      local_172.ucs = L'd';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1ea,&local_172,
                         "testModel.index(3, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'d\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6f7);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      local_1ea = qvariant_cast<QChar>((QVariant *)&args);
      local_172.ucs = L'e';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1ea,&local_172,
                         "testModel.index(4, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'e\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6f8);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001205e2;
      GenericModel::index((int)&local_1c8,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,&local_1c8,0);
      local_1ea = qvariant_cast<QChar>((QVariant *)&args);
      local_172.ucs = L'f';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1ea,&local_172,
                         "testModel.index(5, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'f\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6f9);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001205e2;
      QPersistentModelIndex::data((int)&args);
      local_1c8.r._0_2_ = qvariant_cast<QChar>((QVariant *)&args);
      local_1ea.ucs = L'b';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&local_1c8,&local_1ea,"oneIndex.data().value<QChar>()",
                         "QChar(QLatin1Char(\'b\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x6fa);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_001205e2;
      iVar5 = QPersistentModelIndex::row();
      cVar2 = QTest::qCompare(iVar5,2,"oneIndex.row()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x6fb);
      if (cVar2 == '\0') goto LAB_001205e2;
      lVar6 = 0;
      goto LAB_00120466;
    }
    lVar1 = *(long *)((long)spyArr + lVar6);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6e2);
    if (cVar2 == '\0') break;
  }
  goto LAB_0011fd5e;
LAB_0011fd54:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  goto LAB_0011fd5e;
LAB_00120466:
  do {
    if (lVar6 == 0x10) break;
    lVar1 = *(long *)((long)spyArr + lVar6);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x6fd);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>(&local_1c8,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_1c8,&parIndex,"args.at(0).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x6ff);
    if (!bVar4) {
LAB_001205d8:
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
      break;
    }
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar5,0,"args.at(1).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x700);
    if (cVar2 == '\0') goto LAB_001205d8;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar5,1,"args.at(2).toInt()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x701);
    if (cVar2 == '\0') goto LAB_001205d8;
    qvariant_cast<QModelIndex>(&local_1c8,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_1c8,&parIndex,"args.at(3).value<QModelIndex>()","parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x702);
    if (!bVar4) goto LAB_001205d8;
    iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar5,3,"args.at(4).toInt()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x703);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar6 = lVar6 + 8;
  } while (cVar2 != '\0');
LAB_001205e2:
  QPersistentModelIndex::~QPersistentModelIndex(&oneIndex);
LAB_0011fd5e:
  QPersistentModelIndex::~QPersistentModelIndex(&twoIndex);
LAB_0011fd6b:
  QSignalSpy::~QSignalSpy(&rowsMovedSpy);
LAB_0011fd78:
  QSignalSpy::~QSignalSpy(&rowsAboutToBeMovedSpy);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveRowsTreeSameBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    testModel.insertColumns(0, 2, parIndex);
    testModel.insertRows(0, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    const auto resetData = [&testModel, &parIndex]() {
        for (int i = 0; i < 6; ++i) {
            testModel.setData(testModel.index(i, 0, parIndex), i);
            testModel.setData(testModel.index(i, 1, parIndex), QChar('a' + i));
        }
    };

    resetData();
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, parIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, parIndex, 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, -1, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 6, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 1, 2, parIndex, 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 1, 2, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 4));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 4);
    }

    resetData();
    twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 0));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }

    resetData();
    twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, parIndex, 6));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 6);
    }

    resetData();
    QPersistentModelIndex oneIndex = testModel.index(1, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 0, 2, parIndex, 3));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(oneIndex.data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(oneIndex.row(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 3);
    }
}